

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

ModelPtr __thiscall libcellml::Importer::library(Importer *this,size_t *index)

{
  _Base_ptr *pp_Var1;
  pointer puVar2;
  _Rb_tree_node_base *p_Var3;
  LoggerImpl *pLVar4;
  ulong *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ulong uVar6;
  undefined1 auVar7 [16];
  ModelPtr MVar8;
  
  puVar2 = (pointer)*in_RDX;
  pLVar4 = Logger::pFunc((Logger *)index);
  if (puVar2 < pLVar4[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start) {
    pLVar4 = Logger::pFunc((Logger *)index);
    auVar7._8_8_ = extraout_RDX_00;
    auVar7._0_8_ = pLVar4[1].mWarnings.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
    for (uVar6 = *in_RDX; _Var5._M_pi = auVar7._8_8_, p_Var3 = auVar7._0_8_, uVar6 != 0;
        uVar6 = uVar6 - 1) {
      auVar7 = std::_Rb_tree_increment(p_Var3);
    }
    (this->super_Logger)._vptr_Logger = *(_func_int ***)(p_Var3 + 2);
    pLVar4 = (LoggerImpl *)p_Var3[2]._M_parent;
    (this->super_Logger).mPimpl = pLVar4;
    if (pLVar4 != (LoggerImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pp_Var1 = (_Base_ptr *)
                  &(pLVar4->mErrors).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
        UNLOCK();
      }
      else {
        pp_Var1 = (_Base_ptr *)
                  &(pLVar4->mErrors).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
      }
    }
  }
  else {
    (this->super_Logger)._vptr_Logger = (_func_int **)0x0;
    (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
    _Var5._M_pi = extraout_RDX;
  }
  MVar8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  MVar8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Importer::library(const size_t &index)
{
    if (index >= pFunc()->mLibrary.size()) {
        return nullptr;
    }
    auto it = pFunc()->mLibrary.begin();
    size_t i = 0;
    while (i < index) {
        ++it;
        ++i;
    }
    return it->second;
}